

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

int32_t __thiscall icu_63::RBBITableBuilder::removeDuplicateStates(RBBITableBuilder *this)

{
  bool bVar1;
  int32_t iVar2;
  IntPair dupls;
  IntPair local_20;
  
  local_20.first = 3;
  local_20.second = 0;
  bVar1 = findDuplicateState(this,&local_20);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = 0;
    do {
      removeState(this,local_20);
      iVar2 = iVar2 + 1;
      bVar1 = findDuplicateState(this,&local_20);
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

int32_t RBBITableBuilder::removeDuplicateStates() {
    IntPair dupls = {3, 0};
    int32_t numStatesRemoved = 0;

    while (findDuplicateState(&dupls)) {
        // printf("Removing duplicate states (%d, %d)\n", dupls.first, dupls.second);
        removeState(dupls);
        ++numStatesRemoved;
    }
    return numStatesRemoved;
}